

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

Ptr<Image> __thiscall
myvk::Image::CreateTexture2D
          (Image *this,Ptr<Device> *device,VkExtent2D *size,uint32_t mip_level,VkFormat format,
          VkImageUsageFlags usage,
          vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
          *access_queue)

{
  Ptr<Image> PVar1;
  VkImageCreateInfo local_68;
  
  local_68.pNext = (void *)0x0;
  local_68.queueFamilyIndexCount = 0;
  local_68._68_4_ = 0;
  local_68.pQueueFamilyIndices = (uint32_t *)0x0;
  local_68.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_68._4_4_ = 0;
  local_68.flags = 0;
  local_68.imageType = VK_IMAGE_TYPE_2D;
  local_68.extent.width = (*size).width;
  local_68.extent.height = (*size).height;
  local_68.extent.depth = 1;
  local_68.arrayLayers = 1;
  local_68.mipLevels = mip_level;
  local_68.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_68._84_4_ = 0;
  local_68.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_68.usage = usage;
  local_68.samples = VK_SAMPLE_COUNT_1_BIT;
  local_68.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_68.format = format;
  PVar1 = Create(this,device,&local_68,0,VMA_MEMORY_USAGE_AUTO_PREFER_DEVICE,access_queue);
  PVar1.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Image>)PVar1.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Image> Image::CreateTexture2D(const Ptr<Device> &device, const VkExtent2D &size, uint32_t mip_level,
                                  VkFormat format, VkImageUsageFlags usage,
                                  const std::vector<Ptr<Queue>> &access_queue) {
	VkImageCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
	create_info.imageType = VK_IMAGE_TYPE_2D;
	create_info.extent = {size.width, size.height, 1};
	create_info.mipLevels = mip_level;
	create_info.arrayLayers = 1;
	create_info.format = format;
	create_info.tiling = VK_IMAGE_TILING_OPTIMAL;
	create_info.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
	create_info.usage = usage;
	create_info.samples = VK_SAMPLE_COUNT_1_BIT;

	return Create(device, create_info, 0, VMA_MEMORY_USAGE_AUTO_PREFER_DEVICE, access_queue);
}